

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

size_t QHashPrivate::calculateHash<std::pair<QFontEngine*,int>>
                 (pair<QFontEngine_*,_int> *t,size_t seed)

{
  size_t sVar1;
  pair<QFontEngine_*,_int> *in_RSI;
  size_t in_stack_ffffffffffffffe8;
  
  sVar1 = qHash<QFontEngine*,int>(in_RSI,in_stack_ffffffffffffffe8);
  return sVar1;
}

Assistant:

size_t calculateHash(const T &t, size_t seed = 0)
{
    if constexpr (HasQHashOverload<T>) {
        return qHash(t, seed);
    } else if constexpr (HasStdHashSpecializationWithSeed<T>) {
        return std::hash<T>()(t, seed);
    } else if constexpr (HasStdHashSpecializationWithoutSeed<T>) {
        Q_UNUSED(seed);
        return std::hash<T>()(t);
    } else {
        static_assert(QtPrivate::type_dependent_false<T>(), "The key type must have a qHash overload or a std::hash specialization");
        return 0;
    }
}